

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool goodform::json::parse_object(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *this;
  mapped_type *this_00;
  bool bVar4;
  byte local_91;
  undefined1 local_88 [8];
  any value;
  string key;
  bool parseError;
  bool closingBraceFound;
  char c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_48;
  any *local_18;
  any *v_local;
  istream *input_local;
  
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48._M_t._M_impl._0_8_ = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_18 = v;
  v_local = (any *)input;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map(&local_48);
  std::any::operator=(local_18,&local_48);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&local_48);
  cVar1 = std::istream::get();
  bVar4 = false;
  if (cVar1 == '{') {
    key.field_2._M_local_buf[9] = '\0';
    while( true ) {
      local_91 = 0;
      if ((bVar4 == false) && (local_91 = 0, key.field_2._M_local_buf[9] == '\0')) {
        local_91 = std::ios::good();
      }
      if ((local_91 & 1) == 0) break;
      strip_white_space((istream *)v_local);
      iVar3 = std::istream::peek();
      bVar4 = iVar3 == 0x7d;
      if (bVar4) {
        std::istream::seekg((long)v_local,_S_cur);
      }
      else {
        std::__cxx11::string::string((string *)&value._M_storage);
        bVar2 = read_string((istream *)v_local,(string *)&value._M_storage);
        key.field_2._M_local_buf[9] = (bVar2 ^ 0xffU) & 1;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          strip_white_space((istream *)v_local);
          iVar3 = std::istream::peek();
          key.field_2._M_local_buf[9] = iVar3 != 0x3a;
          if (!(bool)key.field_2._M_local_buf[9]) {
            std::istream::seekg((long)v_local,_S_cur);
            strip_white_space((istream *)v_local);
            std::any::any((any *)local_88);
            bVar2 = deserialize((istream *)v_local,(any *)local_88);
            key.field_2._M_local_buf[9] = ~bVar2 & 1;
            this = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                             (local_18);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                      ::operator[](this,(key_type *)&value._M_storage);
            std::any::operator=(this_00,(any *)local_88);
            if (key.field_2._M_local_buf[9] == 0) {
              strip_white_space((istream *)v_local);
              cVar1 = std::istream::peek();
              bVar4 = cVar1 == '}';
              if ((bVar4) ||
                 (key.field_2._M_local_buf[9] = cVar1 != ',', !(bool)key.field_2._M_local_buf[9])) {
                std::istream::seekg((long)v_local,_S_cur);
              }
            }
            std::any::~any((any *)local_88);
          }
        }
        std::__cxx11::string::~string((string *)&value._M_storage);
      }
    }
  }
  return bVar4;
}

Assistant:

bool json::parse_object(std::istream& input, any& v)
  {
    v = object_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '{')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == '}')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          std::string key;
          if (!(parseError = !read_string(input, key)))
          {
            strip_white_space(input);
            if (!(parseError = (input.peek() != ':')))
            {
              input.seekg(1, std::ios::cur);
              strip_white_space(input);

              any value;
              parseError = !deserialize(input, value);
              get<object_t>(v)[key] = std::move(value);

              if (!parseError)
              {
                strip_white_space(input);
                c = (char)input.peek();
                if ((closingBraceFound = (c == '}')) || !(parseError = (c != ',')))
                  input.seekg(1, std::ios::cur);
              }
            }
          }
        }
      }
    }
    return closingBraceFound;
  }